

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManSimInfoInit(Gia_ManSim_t *p)

{
  int iVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->vCis2Ids->nSize; i_00 = i_00 + 1) {
    iVar1 = Vec_IntEntry(p->vCis2Ids,i_00);
    if (iVar1 < p->pAig->vCis->nSize - p->pAig->nRegs) {
      Gia_ManSimInfoRandom(p,p->pDataSimCis + (long)i_00 * (long)p->nWords);
    }
    else {
      Gia_ManSimInfoZero(p,p->pDataSimCis + (long)i_00 * (long)p->nWords);
    }
  }
  return;
}

Assistant:

void Gia_ManSimInfoInit( Gia_ManSim_t * p )
{
    int iPioNum, i;
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < Gia_ManPiNum(p->pAig) )
            Gia_ManSimInfoRandom( p, Gia_SimDataCi(p, i) );
        else
            Gia_ManSimInfoZero( p, Gia_SimDataCi(p, i) );
    }
}